

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.hpp
# Opt level: O2

void mxx::my_mpi_errorhandler(MPI_Comm *comm,int *error_code,...)

{
  int error_class;
  int strlen;
  string errorstr;
  string classstr;
  char buf [256];
  allocator local_161;
  undefined4 local_160;
  undefined1 local_15c [4];
  allocator local_158 [32];
  string local_138 [32];
  char local_118 [256];
  
  MPI_Error_class(*error_code,&local_160);
  MPI_Error_string(local_160,local_118,local_15c);
  std::__cxx11::string::string(local_138,local_118,local_158);
  MPI_Error_string(*error_code,local_118,local_15c);
  std::__cxx11::string::string((string *)local_158,local_118,&local_161);
  std::terminate();
}

Assistant:

void my_mpi_errorhandler(MPI_Comm* comm, int* error_code, ...) {
    char buf[MPI_MAX_ERROR_STRING];
    int strlen;
    int error_class;

    MPI_Error_class(*error_code, &error_class);
    MPI_Error_string(error_class, buf, &strlen);
    std::string classstr(buf);
    //fprintf(stderr, "%3d: %s\n", my_rank, error_string);
    MPI_Error_string(*error_code, buf, &strlen);
    std::string errorstr(buf);
    //fprintf(stderr, "%3d: %s\n", my_rank, error_string);
    // throw exception, enables gdb stack trace analysis
    std::terminate();
    throw std::runtime_error("[MPI Error] class: " + classstr + "\n[MPI Error] " + errorstr);
}